

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sptk_utils.cc
# Opt level: O0

bool sptk::ConvertStringToDouble(string *input,double *output)

{
  int iVar1;
  ulong uVar2;
  char *__nptr;
  int *piVar3;
  double *in_RSI;
  char *in_RDI;
  double dVar4;
  double converted_value;
  char *end;
  char *local_20;
  double *local_18;
  char *local_10;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  uVar2 = std::__cxx11::string::empty();
  if (((uVar2 & 1) == 0) && (local_18 != (double *)0x0)) {
    __nptr = (char *)std::__cxx11::string::c_str();
    dVar4 = strtod(__nptr,&local_20);
    iVar1 = std::__cxx11::string::compare(local_10);
    if ((iVar1 != 0) && ((*local_20 == '\0' && (piVar3 = __errno_location(), *piVar3 != 0x22)))) {
      *local_18 = dVar4;
      return true;
    }
  }
  return false;
}

Assistant:

bool ConvertStringToDouble(const std::string& input, double* output) {
  if (input.empty() || NULL == output) {
    return false;
  }

  char* end;
  double converted_value(std::strtod(input.c_str(), &end));

  if (0 == input.compare(end) || '\0' != *end || ERANGE == errno) {
    return false;
  }

  *output = converted_value;
  return true;
}